

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O2

int tidySaveSink(TidyDoc tdoc,TidyOutputSink *sink)

{
  int iVar1;
  StreamOut *out;
  
  out = prvTidyUserOutput((TidyDocImpl *)tdoc,sink,tdoc[0x94]._opaque,tdoc[0x8e]._opaque);
  iVar1 = tidyDocSaveStream((TidyDocImpl *)tdoc,out);
  (**(code **)(**(long **)(tdoc + 0xd18) + 0x10))(*(long **)(tdoc + 0xd18),out);
  return iVar1;
}

Assistant:

int TIDY_CALL        tidySaveSink( TidyDoc tdoc, TidyOutputSink* sink )
{
    TidyDocImpl* doc = tidyDocToImpl( tdoc );
    return tidyDocSaveSink( doc, sink );
}